

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::session_stats_header_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,session_stats_header_alert *this)

{
  bool bVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  reference psVar5;
  stats_metric *s;
  iterator __end1;
  iterator __begin1;
  vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> *__range1;
  bool first;
  undefined1 local_48 [8];
  vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> stats;
  allocator<char> local_1a;
  byte local_19;
  session_stats_header_alert *local_18;
  session_stats_header_alert *this_local;
  string *stats_header;
  
  local_19 = 0;
  local_18 = this;
  this_local = (session_stats_header_alert *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"session stats header: ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  session_stats_metrics();
  iVar3 = std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>::begin
                    ((vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> *)
                     local_48);
  iVar4 = std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>::end
                    ((vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> *)
                     local_48);
  std::
  sort<__gnu_cxx::__normal_iterator<libtorrent::stats_metric*,std::vector<libtorrent::stats_metric,std::allocator<libtorrent::stats_metric>>>,libtorrent::session_stats_header_alert::message[abi:cxx11]()const::__0>
            (iVar3._M_current,iVar4._M_current);
  bVar1 = true;
  __end1 = std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>::begin
                     ((vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> *
                      )local_48);
  s = (stats_metric *)
      std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>::end
                ((vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> *)
                 local_48);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<libtorrent::stats_metric_*,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
                                *)&s);
    if (!bVar2) break;
    psVar5 = __gnu_cxx::
             __normal_iterator<libtorrent::stats_metric_*,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
             ::operator*(&__end1);
    if (!bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,psVar5->name);
    bVar1 = false;
    __gnu_cxx::
    __normal_iterator<libtorrent::stats_metric_*,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
    ::operator++(&__end1);
  }
  local_19 = 1;
  std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>::~vector
            ((vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> *)local_48
            );
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string session_stats_header_alert::message() const
	{
		std::string stats_header = "session stats header: ";
		std::vector<stats_metric> stats = session_stats_metrics();
		std::sort(stats.begin(), stats.end()
			, [] (stats_metric const& lhs, stats_metric const& rhs)
			{ return lhs.value_index < rhs.value_index; });
		bool first = true;
		for (auto const& s : stats)
		{
			if (!first) stats_header += ", ";
			stats_header += s.name;
			first = false;
		}

		return stats_header;
	}